

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int bbSPIXfer(uint CS,char *inBuf,char *outBuf,uint count)

{
  uint32_t *puVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  uint32_t *puVar4;
  long lVar5;
  char cVar6;
  uint32_t *puVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  
  __stream = _stderr;
  uVar8 = (ulong)CS;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,inBuf);
    fprintf(__stream,"%s %s: CS=%d inBuf=%s outBuf=%08X count=%d\n",myTimeStamp::buf,"bbSPIXfer",
            uVar8,myBuf2Str::str,outBuf,(ulong)count);
  }
  if (libInitialised == '\0') {
    count = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      bbSPIXfer_cold_1();
    }
  }
  else if (CS < 0x20) {
    if (wfRx[uVar8].mode == 7) {
      if (inBuf == (char *)0x0 || count == 0) {
        count = 0xffffffa6;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          bbSPIXfer_cold_3();
        }
      }
      else if (outBuf == (char *)0x0) {
        count = 0xffffffa6;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          bbSPIXfer_cold_4();
        }
      }
      else {
        iVar2 = wfRx[uVar8].field_4.s.readPos;
        wfRx[iVar2].field_4.I.SDA = CS;
        wfRx[iVar2].baud = wfRx[uVar8].baud;
        *(undefined8 *)((long)&wfRx[iVar2].field_4 + 0x14) =
             *(undefined8 *)((long)&wfRx[uVar8].field_4 + 0x14);
        pthread_mutex_lock((pthread_mutex_t *)&wfRx[iVar2].mutex);
        uVar3 = wfRx[iVar2].field_4.s.readPos;
        lVar5 = 0x1c;
        if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 2) == 0) {
          lVar5 = 0x28;
        }
        lVar10 = 0x1c;
        *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar5) = 1 << ((byte)uVar3 & 0x1f);
        myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
        uVar3 = wfRx[iVar2].field_4.I.SDA;
        if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 4) == 0) {
          lVar10 = 0x28;
        }
        *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar10) = 1 << ((byte)uVar3 & 0x1f);
        myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
        uVar8 = 0;
        do {
          bVar9 = inBuf[uVar8];
          if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 1) == 0) {
            cVar6 = '\b';
            bVar11 = 0;
            do {
              uVar3 = wfRx[iVar2].field_4.s.bufSize;
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x19) & 0x40) == 0) {
                lVar5 = 0x1c;
                if (-1 < (char)bVar9) {
                  lVar5 = 0x28;
                }
                *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar5) =
                     1 << ((byte)uVar3 & 0x1f);
                bVar9 = bVar9 * '\x02';
              }
              else {
                lVar5 = 0x1c;
                if ((bVar9 & 1) == 0) {
                  lVar5 = 0x28;
                }
                *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar5) =
                     1 << ((byte)uVar3 & 0x1f);
                bVar9 = (char)bVar9 >> 1;
              }
              myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
              puVar1 = gpioReg;
              uVar3 = wfRx[iVar2].field_4.s.readPos;
              puVar4 = gpioReg + 10;
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 2) == 0) {
                puVar4 = gpioReg + 7;
              }
              puVar4[uVar3 >> 5] = 1 << ((byte)uVar3 & 0x1f);
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x19) & 0x80) == 0) {
                uVar3 = wfRx[iVar2].field_4.I.SCL;
                bVar11 = ((puVar1[(ulong)(uVar3 >> 5) + 0xd] >> (uVar3 & 0x1f) & 1) != 0) +
                         bVar11 * '\x02';
              }
              else {
                uVar3 = wfRx[iVar2].field_4.I.SCL;
                bVar11 = bVar11 >> 1 |
                         (char)(puVar1[(ulong)(uVar3 >> 5) + 0xd] >> ((byte)uVar3 & 0x1f)) << 7;
              }
              myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
              uVar3 = wfRx[iVar2].field_4.s.readPos;
              lVar5 = 0x1c;
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 2) == 0) {
                lVar5 = 0x28;
              }
              *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar5) = 1 << ((byte)uVar3 & 0x1f);
              cVar6 = cVar6 + -1;
            } while (cVar6 != '\0');
          }
          else {
            cVar6 = '\b';
            bVar11 = 0;
            do {
              uVar3 = wfRx[iVar2].field_4.s.readPos;
              puVar1 = gpioReg + 10;
              puVar4 = gpioReg + 7;
              puVar7 = puVar1;
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 2) == 0) {
                puVar7 = puVar4;
              }
              puVar7[uVar3 >> 5] = 1 << ((byte)uVar3 & 0x1f);
              uVar3 = wfRx[iVar2].field_4.s.bufSize;
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x19) & 0x40) == 0) {
                if (-1 < (char)bVar9) {
                  puVar4 = puVar1;
                }
                puVar4[uVar3 >> 5] = 1 << ((byte)uVar3 & 0x1f);
                bVar9 = bVar9 * '\x02';
              }
              else {
                if ((bVar9 & 1) == 0) {
                  puVar4 = puVar1;
                }
                puVar4[uVar3 >> 5] = 1 << ((byte)uVar3 & 0x1f);
                bVar9 = (char)bVar9 >> 1;
              }
              myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
              puVar1 = gpioReg;
              uVar3 = wfRx[iVar2].field_4.s.readPos;
              puVar4 = gpioReg + 7;
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 2) == 0) {
                puVar4 = gpioReg + 10;
              }
              puVar4[uVar3 >> 5] = 1 << ((byte)uVar3 & 0x1f);
              if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x19) & 0x80) == 0) {
                uVar3 = wfRx[iVar2].field_4.I.SCL;
                bVar11 = ((puVar1[(ulong)(uVar3 >> 5) + 0xd] >> (uVar3 & 0x1f) & 1) != 0) +
                         bVar11 * '\x02';
              }
              else {
                uVar3 = wfRx[iVar2].field_4.I.SCL;
                bVar11 = bVar11 >> 1 |
                         (char)(puVar1[(ulong)(uVar3 >> 5) + 0xd] >> ((byte)uVar3 & 0x1f)) << 7;
              }
              myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
              cVar6 = cVar6 + -1;
            } while (cVar6 != '\0');
          }
          outBuf[uVar8] = bVar11;
          uVar8 = uVar8 + 1;
        } while (uVar8 != count);
        myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
        uVar3 = wfRx[iVar2].field_4.I.SDA;
        lVar10 = 0x1c;
        lVar5 = 0x28;
        if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 4) == 0) {
          lVar5 = 0x1c;
        }
        *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar5) = 1 << ((byte)uVar3 & 0x1f);
        myGpioDelay(wfRx[iVar2].field_4.s.fullBit);
        uVar3 = wfRx[iVar2].field_4.s.readPos;
        if ((*(byte *)((long)&wfRx[iVar2].field_4 + 0x18) & 2) == 0) {
          lVar10 = 0x28;
        }
        *(int *)((long)gpioReg + (ulong)(uVar3 >> 5) * 4 + lVar10) = 1 << ((byte)uVar3 & 0x1f);
        pthread_mutex_unlock((pthread_mutex_t *)&wfRx[iVar2].mutex);
      }
    }
    else {
      count = 0xffffff72;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        bbSPIXfer_cold_2();
      }
    }
  }
  else {
    count = 0xfffffffe;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      bbSPIXfer_cold_5();
    }
  }
  return count;
}

Assistant:

int bbSPIXfer(
   unsigned CS,
   char *inBuf,
   char *outBuf,
   unsigned count)
{
   int SCLK;
   int pos;
   wfRx_t *w;

   DBG(DBG_USER, "CS=%d inBuf=%s outBuf=%08X count=%d",
      CS, myBuf2Str(count, (char *)inBuf), (int)outBuf, count);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   if (wfRx[CS].mode != PI_WFRX_SPI_CS)
      SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

   if (!inBuf || !count)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && count)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   SCLK = wfRx[CS].S.SCLK;

   wfRx[SCLK].S.CS = CS;
   wfRx[SCLK].baud = wfRx[CS].baud;
   wfRx[SCLK].S.delay = wfRx[CS].S.delay;
   wfRx[SCLK].S.spiFlags = wfRx[CS].S.spiFlags;

   w = &wfRx[SCLK];

   wfRx_lock(SCLK);

   bbSPIStart(w);
     
   for (pos=0; pos < count; pos++)
   {
      outBuf[pos] = bbSPIXferByte(w, inBuf[pos]);
   }

   bbSPIStop(w);

   wfRx_unlock(SCLK);

   return count;
}